

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFilePathChecksum.cxx
# Opt level: O3

string * __thiscall
cmFilePathChecksum::get(string *__return_storage_ptr__,cmFilePathChecksum *this,string *filePath)

{
  bool bVar1;
  long lVar2;
  string fileReal;
  vector<unsigned_char,_std::allocator<unsigned_char>_> hashBytes;
  string relPath;
  string relSeed;
  string local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  cmsys::SystemTools::GetRealPath(&local_f0,filePath,(string *)0x0);
  local_d0._M_string_length = 0;
  local_d0.field_2._M_local_buf[0] = '\0';
  lVar2 = 4;
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  while ((((string *)this)->_M_string_length == 0 ||
         (bVar1 = cmsys::SystemTools::IsSubDirectory(&local_f0,(string *)this), !bVar1))) {
    this = (cmFilePathChecksum *)((long)this + 0x40);
    lVar2 = lVar2 + -1;
    if (lVar2 == 0) {
LAB_0043ca22:
      if (local_d0._M_string_length == 0) {
        std::__cxx11::string::_M_replace
                  ((ulong)&local_70,0,(char *)local_70._M_string_length,0x58671e);
        cmsys::SystemTools::SplitPathRootComponent(&local_f0,&local_d0);
      }
      cmsys::SystemTools::GetParentDirectory(&local_50,&local_f0);
      cmsys::SystemTools::RelativePath(&local_90,&local_d0,&local_50);
      std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,
                        CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                                 local_d0.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      cmCryptoHash::cmCryptoHash((cmCryptoHash *)&local_90,AlgoSHA256);
      std::operator+(&local_f0,&local_70,&local_b0);
      cmCryptoHash::ByteHashString
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_d0,
                 (cmCryptoHash *)&local_90,&local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      cmCryptoHash::~cmCryptoHash((cmCryptoHash *)&local_90);
      cmBase32Encoder::cmBase32Encoder((cmBase32Encoder *)&local_f0);
      cmBase32Encoder::encodeString_abi_cxx11_
                (__return_storage_ptr__,(cmBase32Encoder *)&local_f0,
                 (uchar *)local_d0._M_dataplus._M_p,
                 local_d0._M_string_length - (long)local_d0._M_dataplus._M_p,false);
      cmBase32Encoder::~cmBase32Encoder((cmBase32Encoder *)&local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_d0._M_dataplus._M_p,
                        CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                                 local_d0.field_2._M_local_buf[0]) - (long)local_d0._M_dataplus._M_p
                       );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,
                        CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                                 local_70.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,
                        CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                                 local_b0.field_2._M_local_buf[0]) + 1);
      }
      return __return_storage_ptr__;
    }
  }
  std::__cxx11::string::_M_assign((string *)&local_70);
  std::__cxx11::string::_M_assign((string *)&local_d0);
  goto LAB_0043ca22;
}

Assistant:

std::string cmFilePathChecksum::get(const std::string& filePath) const
{
  std::string relPath;
  std::string relSeed;
  {
    const std::string fileReal = cmsys::SystemTools::GetRealPath(filePath);
    std::string parentDir;
    // Find closest project parent directory
    for (size_t ii = 0; ii != numParentDirs; ++ii) {
      const std::string& pDir = parentDirs[ii].first;
      if (!pDir.empty() &&
          cmsys::SystemTools::IsSubDirectory(fileReal, pDir)) {
        relSeed = parentDirs[ii].second;
        parentDir = pDir;
        break;
      }
    }
    // Use file system root as fallback parent directory
    if (parentDir.empty()) {
      relSeed = "FileSystemRoot";
      cmsys::SystemTools::SplitPathRootComponent(fileReal, &parentDir);
    }
    // Calculate relative path from project parent directory
    relPath = cmsys::SystemTools::RelativePath(
      parentDir, cmsys::SystemTools::GetParentDirectory(fileReal));
  }

  // Calculate the file ( seed + relative path ) binary checksum
  std::vector<unsigned char> hashBytes =
    cmCryptoHash(cmCryptoHash::AlgoSHA256).ByteHashString(relSeed + relPath);

  // Convert binary checksum to string
  return cmBase32Encoder().encodeString(&hashBytes[0], hashBytes.size(),
                                        false);
}